

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined4 uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar60;
  float fVar61;
  undefined1 auVar57 [16];
  float fVar62;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vfloat4 b0;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar73;
  float fVar74;
  vfloat4 a0_1;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar75;
  undefined1 auVar72 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  vfloat4 a0_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  vfloat4 b0_1;
  undefined1 auVar88 [16];
  float fVar89;
  float fVar92;
  float fVar93;
  undefined1 auVar90 [16];
  float fVar94;
  undefined1 auVar91 [16];
  float fVar95;
  float fVar97;
  float fVar98;
  undefined1 auVar96 [16];
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  vfloat4 a0;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  
  pBVar5 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.vertices.
           items;
  uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar6 = (pBVar5->super_RawBufferView).ptr_ofs;
  sVar7 = (pBVar5->super_RawBufferView).stride;
  lVar11 = sVar7 * uVar4;
  lVar9 = sVar7 * (uVar4 + 1);
  lVar12 = sVar7 * (uVar4 + 2);
  lVar10 = sVar7 * (uVar4 + 3);
  fVar67 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar17 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar11),
                          ZEXT416((uint)(fVar67 * *(float *)(pcVar6 + lVar11 + 0xc))),0x30);
  auVar49 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar9),
                          ZEXT416((uint)(fVar67 * *(float *)(pcVar6 + lVar9 + 0xc))),0x30);
  auVar68 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar12),
                          ZEXT416((uint)(fVar67 * *(float *)(pcVar6 + lVar12 + 0xc))),0x30);
  auVar50 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar10),
                          ZEXT416((uint)(fVar67 * *(float *)(pcVar6 + lVar10 + 0xc))),0x30);
  pBVar8 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.normals.
           items;
  pcVar6 = (pBVar8->super_RawBufferView).ptr_ofs;
  sVar7 = (pBVar8->super_RawBufferView).stride;
  auVar20 = *(undefined1 (*) [16])(pcVar6 + uVar4 * sVar7);
  auVar15 = *(undefined1 (*) [16])(pcVar6 + (uVar4 + 1) * sVar7);
  auVar18 = *(undefined1 (*) [16])(pcVar6 + (uVar4 + 2) * sVar7);
  pfVar1 = (float *)(pcVar6 + sVar7 * (uVar4 + 3));
  fVar67 = *pfVar1;
  fVar73 = pfVar1[1];
  fVar74 = pfVar1[2];
  fVar75 = pfVar1[3];
  auVar48 = ZEXT816(0) << 0x20;
  fVar43 = auVar50._0_4_;
  auVar13._0_4_ = fVar43 * 0.0;
  fVar45 = auVar50._4_4_;
  auVar13._4_4_ = fVar45 * 0.0;
  fVar46 = auVar50._8_4_;
  auVar13._8_4_ = fVar46 * 0.0;
  fVar47 = auVar50._12_4_;
  auVar13._12_4_ = fVar47 * 0.0;
  auVar90._8_4_ = 0x3e2aaaab;
  auVar90._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar90._12_4_ = 0x3e2aaaab;
  auVar50 = vfmadd213ps_fma(auVar90,auVar68,auVar13);
  auVar96._8_4_ = 0x3f2aaaab;
  auVar96._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar96._12_4_ = 0x3f2aaaab;
  auVar50 = vfmadd231ps_fma(auVar50,auVar49,auVar96);
  auVar50 = vfmadd231ps_fma(auVar50,auVar17,auVar90);
  auVar100._8_4_ = 0x3f000000;
  auVar100._0_8_ = 0x3f0000003f000000;
  auVar100._12_4_ = 0x3f000000;
  auVar13 = vfmadd231ps_fma(auVar13,auVar68,auVar100);
  auVar13 = vfnmadd231ps_fma(auVar13,auVar49,auVar48);
  auVar19 = vfnmadd231ps_fma(auVar13,auVar17,auVar100);
  auVar102._0_4_ = fVar67 * 0.0;
  auVar102._4_4_ = fVar73 * 0.0;
  auVar102._8_4_ = fVar74 * 0.0;
  auVar102._12_4_ = fVar75 * 0.0;
  auVar13 = vfmadd213ps_avx512vl(auVar90,auVar18,auVar102);
  auVar13 = vfmadd231ps_avx512vl(auVar13,auVar15,auVar96);
  auVar14 = vfmadd231ps_avx512vl(auVar13,auVar20,auVar90);
  auVar13 = vfmadd231ps_fma(auVar102,auVar18,auVar100);
  auVar13 = vfnmadd231ps_fma(auVar13,auVar15,auVar48);
  auVar16 = vfnmadd231ps_fma(auVar13,auVar20,auVar100);
  auVar54._0_4_ = fVar43 * 0.16666667;
  auVar54._4_4_ = fVar45 * 0.16666667;
  auVar54._8_4_ = fVar46 * 0.16666667;
  auVar54._12_4_ = fVar47 * 0.16666667;
  auVar13 = vfmadd231ps_fma(auVar54,auVar68,auVar96);
  auVar13 = vfmadd231ps_fma(auVar13,auVar49,auVar90);
  auVar13 = vfmadd231ps_fma(auVar13,auVar17,auVar48);
  auVar57._0_4_ = fVar43 * 0.5;
  auVar57._4_4_ = fVar45 * 0.5;
  auVar57._8_4_ = fVar46 * 0.5;
  auVar57._12_4_ = fVar47 * 0.5;
  auVar68 = vfmadd231ps_fma(auVar57,auVar48,auVar68);
  auVar49 = vfnmadd231ps_fma(auVar68,auVar100,auVar49);
  auVar44 = vfnmadd231ps_fma(auVar49,auVar48,auVar17);
  auVar68._0_4_ = fVar67 * 0.16666667;
  auVar68._4_4_ = fVar73 * 0.16666667;
  auVar68._8_4_ = fVar74 * 0.16666667;
  auVar68._12_4_ = fVar75 * 0.16666667;
  auVar17 = vfmadd231ps_fma(auVar68,auVar18,auVar96);
  auVar17 = vfmadd231ps_fma(auVar17,auVar15,auVar90);
  auVar49 = vfmadd231ps_fma(auVar17,auVar20,auVar48);
  auVar79._0_4_ = fVar67 * 0.5;
  auVar79._4_4_ = fVar73 * 0.5;
  auVar79._8_4_ = fVar74 * 0.5;
  auVar79._12_4_ = fVar75 * 0.5;
  auVar18 = vfmadd231ps_fma(auVar79,auVar48,auVar18);
  auVar15 = vfnmadd231ps_fma(auVar18,auVar15,auVar100);
  auVar68 = vfnmadd231ps_fma(auVar15,auVar48,auVar20);
  auVar20 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar15 = vshufps_avx512vl(auVar14,auVar14,0xc9);
  fVar43 = auVar19._0_4_;
  auVar76._0_4_ = fVar43 * auVar15._0_4_;
  fVar45 = auVar19._4_4_;
  auVar76._4_4_ = fVar45 * auVar15._4_4_;
  fVar46 = auVar19._8_4_;
  auVar76._8_4_ = fVar46 * auVar15._8_4_;
  fVar47 = auVar19._12_4_;
  auVar76._12_4_ = fVar47 * auVar15._12_4_;
  auVar15 = vfmsub231ps_avx512vl(auVar76,auVar20,auVar14);
  auVar18 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar15 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar83._0_4_ = auVar15._0_4_ * fVar43;
  auVar83._4_4_ = auVar15._4_4_ * fVar45;
  auVar83._8_4_ = auVar15._8_4_ * fVar46;
  auVar83._12_4_ = auVar15._12_4_ * fVar47;
  auVar20 = vfmsub231ps_fma(auVar83,auVar20,auVar16);
  auVar17 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar20 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar15 = vshufps_avx(auVar49,auVar49,0xc9);
  fVar56 = auVar44._0_4_;
  auVar63._0_4_ = fVar56 * auVar15._0_4_;
  fVar60 = auVar44._4_4_;
  auVar63._4_4_ = fVar60 * auVar15._4_4_;
  fVar61 = auVar44._8_4_;
  auVar63._8_4_ = fVar61 * auVar15._8_4_;
  fVar62 = auVar44._12_4_;
  auVar63._12_4_ = fVar62 * auVar15._12_4_;
  auVar15 = vfmsub231ps_fma(auVar63,auVar20,auVar49);
  auVar49 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar15 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar69._0_4_ = fVar56 * auVar15._0_4_;
  auVar69._4_4_ = fVar60 * auVar15._4_4_;
  auVar69._8_4_ = fVar61 * auVar15._8_4_;
  auVar69._12_4_ = fVar62 * auVar15._12_4_;
  auVar20 = vfmsub231ps_fma(auVar69,auVar20,auVar68);
  auVar68 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar20 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar52 = SUB1612(ZEXT816(0),0);
  auVar88._4_12_ = auVar52;
  auVar88._0_4_ = auVar20._0_4_;
  auVar15 = vrsqrt14ss_avx512f(auVar48,auVar88);
  fVar67 = auVar15._0_4_;
  fVar67 = fVar67 * 1.5 + auVar20._0_4_ * -0.5 * fVar67 * fVar67 * fVar67;
  fVar95 = fVar67 * auVar18._0_4_;
  fVar97 = fVar67 * auVar18._4_4_;
  fVar98 = fVar67 * auVar18._8_4_;
  fVar99 = fVar67 * auVar18._12_4_;
  auVar15 = vdpps_avx(auVar18,auVar17,0x7f);
  auVar16 = vbroadcastss_avx512vl(auVar20);
  auVar17 = vmulps_avx512vl(auVar16,auVar17);
  fVar73 = auVar15._0_4_;
  auVar77._0_4_ = fVar73 * auVar18._0_4_;
  auVar77._4_4_ = fVar73 * auVar18._4_4_;
  auVar77._8_4_ = fVar73 * auVar18._8_4_;
  auVar77._12_4_ = fVar73 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar17,auVar77);
  auVar15 = vrcp14ss_avx512f(auVar48,auVar88);
  auVar20 = vfnmadd213ss_fma(auVar20,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar74 = auVar15._0_4_ * auVar20._0_4_;
  auVar20 = vdpps_avx(auVar49,auVar49,0x7f);
  fVar75 = auVar20._0_4_;
  auVar80._4_12_ = auVar52;
  auVar80._0_4_ = fVar75;
  auVar15 = vrsqrt14ss_avx512f(auVar48,auVar80);
  fVar73 = auVar15._0_4_;
  fVar73 = fVar73 * 1.5 + fVar75 * -0.5 * fVar73 * fVar73 * fVar73;
  fVar89 = fVar73 * auVar49._0_4_;
  fVar92 = fVar73 * auVar49._4_4_;
  fVar93 = fVar73 * auVar49._8_4_;
  fVar94 = fVar73 * auVar49._12_4_;
  auVar15 = vdpps_avx(auVar49,auVar68,0x7f);
  auVar70._0_4_ = fVar75 * auVar68._0_4_;
  auVar70._4_4_ = fVar75 * auVar68._4_4_;
  auVar70._8_4_ = fVar75 * auVar68._8_4_;
  auVar70._12_4_ = fVar75 * auVar68._12_4_;
  fVar75 = auVar15._0_4_;
  auVar17._0_4_ = fVar75 * auVar49._0_4_;
  auVar17._4_4_ = fVar75 * auVar49._4_4_;
  auVar17._8_4_ = fVar75 * auVar49._8_4_;
  auVar17._12_4_ = fVar75 * auVar49._12_4_;
  auVar17 = vsubps_avx(auVar70,auVar17);
  auVar15 = vrcp14ss_avx512f(auVar48,auVar80);
  auVar20 = vfnmadd213ss_fma(auVar20,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar75 = auVar20._0_4_ * auVar15._0_4_;
  auVar20 = vshufps_avx(auVar50,auVar50,0xff);
  auVar71._0_4_ = fVar95 * auVar20._0_4_;
  auVar71._4_4_ = fVar97 * auVar20._4_4_;
  auVar71._8_4_ = fVar98 * auVar20._8_4_;
  auVar71._12_4_ = fVar99 * auVar20._12_4_;
  auVar49 = vsubps_avx(auVar50,auVar71);
  auVar15 = vshufps_avx(auVar19,auVar19,0xff);
  auVar64._0_4_ = auVar15._0_4_ * fVar95 + auVar20._0_4_ * fVar67 * fVar74 * auVar18._0_4_;
  auVar64._4_4_ = auVar15._4_4_ * fVar97 + auVar20._4_4_ * fVar67 * fVar74 * auVar18._4_4_;
  auVar64._8_4_ = auVar15._8_4_ * fVar98 + auVar20._8_4_ * fVar67 * fVar74 * auVar18._8_4_;
  auVar64._12_4_ = auVar15._12_4_ * fVar99 + auVar20._12_4_ * fVar67 * fVar74 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar19,auVar64);
  auVar84._0_4_ = auVar50._0_4_ + auVar71._0_4_;
  auVar84._4_4_ = auVar50._4_4_ + auVar71._4_4_;
  auVar84._8_4_ = auVar50._8_4_ + auVar71._8_4_;
  auVar84._12_4_ = auVar50._12_4_ + auVar71._12_4_;
  auVar20 = vshufps_avx(auVar13,auVar13,0xff);
  auVar65._0_4_ = fVar89 * auVar20._0_4_;
  auVar65._4_4_ = fVar92 * auVar20._4_4_;
  auVar65._8_4_ = fVar93 * auVar20._8_4_;
  auVar65._12_4_ = fVar94 * auVar20._12_4_;
  auVar68 = vsubps_avx(auVar13,auVar65);
  auVar15 = vshufps_avx(auVar44,auVar44,0xff);
  auVar50._0_4_ = fVar89 * auVar15._0_4_ + auVar20._0_4_ * fVar73 * auVar17._0_4_ * fVar75;
  auVar50._4_4_ = fVar92 * auVar15._4_4_ + auVar20._4_4_ * fVar73 * auVar17._4_4_ * fVar75;
  auVar50._8_4_ = fVar93 * auVar15._8_4_ + auVar20._8_4_ * fVar73 * auVar17._8_4_ * fVar75;
  auVar50._12_4_ = fVar94 * auVar15._12_4_ + auVar20._12_4_ * fVar73 * auVar17._12_4_ * fVar75;
  auVar20 = vsubps_avx(auVar44,auVar50);
  auVar48._0_4_ = auVar13._0_4_ + auVar65._0_4_;
  auVar48._4_4_ = auVar13._4_4_ + auVar65._4_4_;
  auVar48._8_4_ = auVar13._8_4_ + auVar65._8_4_;
  auVar48._12_4_ = auVar13._12_4_ + auVar65._12_4_;
  fVar67 = auVar49._0_4_;
  auVar58._0_4_ = fVar67 + auVar18._0_4_ * 0.33333334;
  auVar58._4_4_ = auVar49._4_4_ + auVar18._4_4_ * 0.33333334;
  auVar58._8_4_ = auVar49._8_4_ + auVar18._8_4_ * 0.33333334;
  auVar58._12_4_ = auVar49._12_4_ + auVar18._12_4_ * 0.33333334;
  auVar66._0_4_ = auVar20._0_4_ * 0.33333334;
  auVar66._4_4_ = auVar20._4_4_ * 0.33333334;
  auVar66._8_4_ = auVar20._8_4_ * 0.33333334;
  auVar66._12_4_ = auVar20._12_4_ * 0.33333334;
  auVar17 = vsubps_avx(auVar68,auVar66);
  auVar91._0_4_ = auVar84._0_4_ + (fVar43 + auVar64._0_4_) * 0.33333334;
  auVar91._4_4_ = auVar84._4_4_ + (fVar45 + auVar64._4_4_) * 0.33333334;
  auVar91._8_4_ = auVar84._8_4_ + (fVar46 + auVar64._8_4_) * 0.33333334;
  auVar91._12_4_ = auVar84._12_4_ + (fVar47 + auVar64._12_4_) * 0.33333334;
  auVar20._0_4_ = (fVar56 + auVar50._0_4_) * 0.33333334;
  auVar20._4_4_ = (fVar60 + auVar50._4_4_) * 0.33333334;
  auVar20._8_4_ = (fVar61 + auVar50._8_4_) * 0.33333334;
  auVar20._12_4_ = (fVar62 + auVar50._12_4_) * 0.33333334;
  auVar50 = vsubps_avx(auVar48,auVar20);
  auVar19._4_4_ = fVar67;
  auVar19._0_4_ = fVar67;
  auVar19._8_4_ = fVar67;
  auVar19._12_4_ = fVar67;
  auVar15 = vshufps_avx(auVar49,auVar49,0x55);
  aVar2 = (space->vx).field_0;
  aVar3 = (space->vy).field_0;
  auVar20 = *(undefined1 (*) [16])(space->vz).field_0.m128;
  auVar18 = vshufps_avx(auVar49,auVar49,0xaa);
  fVar67 = auVar20._0_4_;
  auVar55._0_4_ = fVar67 * auVar18._0_4_;
  fVar73 = auVar20._4_4_;
  auVar55._4_4_ = fVar73 * auVar18._4_4_;
  fVar74 = auVar20._8_4_;
  auVar55._8_4_ = fVar74 * auVar18._8_4_;
  fVar75 = auVar20._12_4_;
  auVar55._12_4_ = fVar75 * auVar18._12_4_;
  auVar15 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar3,auVar15);
  auVar49 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar2,auVar19);
  auVar16._4_4_ = auVar58._0_4_;
  auVar16._0_4_ = auVar58._0_4_;
  auVar16._8_4_ = auVar58._0_4_;
  auVar16._12_4_ = auVar58._0_4_;
  auVar15 = vshufps_avx(auVar58,auVar58,0x55);
  auVar18 = vshufps_avx(auVar58,auVar58,0xaa);
  auVar81._0_4_ = fVar67 * auVar18._0_4_;
  auVar81._4_4_ = fVar73 * auVar18._4_4_;
  auVar81._8_4_ = fVar74 * auVar18._8_4_;
  auVar81._12_4_ = fVar75 * auVar18._12_4_;
  auVar15 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar3,auVar15);
  auVar13 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar2,auVar16);
  uVar53 = auVar17._0_4_;
  auVar44._4_4_ = uVar53;
  auVar44._0_4_ = uVar53;
  auVar44._8_4_ = uVar53;
  auVar44._12_4_ = uVar53;
  auVar15 = vshufps_avx(auVar17,auVar17,0x55);
  auVar18 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar101._0_4_ = fVar67 * auVar18._0_4_;
  auVar101._4_4_ = fVar73 * auVar18._4_4_;
  auVar101._8_4_ = fVar74 * auVar18._8_4_;
  auVar101._12_4_ = fVar75 * auVar18._12_4_;
  auVar15 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar3,auVar15);
  auVar17 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar2,auVar44);
  uVar53 = auVar68._0_4_;
  auVar14._4_4_ = uVar53;
  auVar14._0_4_ = uVar53;
  auVar14._8_4_ = uVar53;
  auVar14._12_4_ = uVar53;
  auVar15 = vshufps_avx(auVar68,auVar68,0x55);
  auVar18 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar103._0_4_ = fVar67 * auVar18._0_4_;
  auVar103._4_4_ = fVar73 * auVar18._4_4_;
  auVar103._8_4_ = fVar74 * auVar18._8_4_;
  auVar103._12_4_ = fVar75 * auVar18._12_4_;
  auVar15 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar3,auVar15);
  auVar68 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar2,auVar14);
  auVar51._4_4_ = auVar84._0_4_;
  auVar51._0_4_ = auVar84._0_4_;
  auVar51._8_4_ = auVar84._0_4_;
  auVar51._12_4_ = auVar84._0_4_;
  auVar15 = vshufps_avx(auVar84,auVar84,0x55);
  auVar18 = vshufps_avx(auVar84,auVar84,0xaa);
  auVar18 = vmulps_avx512vl(auVar20,auVar18);
  auVar15 = vfmadd231ps_avx512vl(auVar18,(undefined1  [16])aVar3,auVar15);
  auVar19 = vfmadd231ps_avx512vl(auVar15,(undefined1  [16])aVar2,auVar51);
  auVar59._4_4_ = auVar91._0_4_;
  auVar59._0_4_ = auVar91._0_4_;
  auVar59._8_4_ = auVar91._0_4_;
  auVar59._12_4_ = auVar91._0_4_;
  auVar15 = vshufps_avx(auVar91,auVar91,0x55);
  auVar18 = vshufps_avx(auVar91,auVar91,0xaa);
  auVar20 = vmulps_avx512vl(auVar20,auVar18);
  auVar20 = vfmadd231ps_avx512vl(auVar20,(undefined1  [16])aVar3,auVar15);
  auVar16 = vfmadd231ps_avx512vl(auVar20,(undefined1  [16])aVar2,auVar59);
  uVar53 = auVar50._0_4_;
  auVar85._4_4_ = uVar53;
  auVar85._0_4_ = uVar53;
  auVar85._8_4_ = uVar53;
  auVar85._12_4_ = uVar53;
  auVar20 = vshufps_avx(auVar50,auVar50,0x55);
  auVar15 = vshufps_avx(auVar50,auVar50,0xaa);
  auVar18._0_4_ = fVar67 * auVar15._0_4_;
  auVar18._4_4_ = fVar73 * auVar15._4_4_;
  auVar18._8_4_ = fVar74 * auVar15._8_4_;
  auVar18._12_4_ = fVar75 * auVar15._12_4_;
  auVar20 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar3,auVar20);
  auVar18 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar2,auVar85);
  auVar86._4_4_ = auVar48._0_4_;
  auVar86._0_4_ = auVar48._0_4_;
  auVar86._8_4_ = auVar48._0_4_;
  auVar86._12_4_ = auVar48._0_4_;
  auVar20 = vshufps_avx(auVar48,auVar48,0x55);
  auVar15 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar72._0_4_ = fVar67 * auVar15._0_4_;
  auVar72._4_4_ = fVar73 * auVar15._4_4_;
  auVar72._8_4_ = fVar74 * auVar15._8_4_;
  auVar72._12_4_ = fVar75 * auVar15._12_4_;
  auVar20 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar3,auVar20);
  auVar20 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar2,auVar86);
  auVar21 = vbroadcastss_avx512vl(ZEXT416(1));
  uVar53 = auVar49._0_4_;
  auVar37._4_4_ = uVar53;
  auVar37._0_4_ = uVar53;
  auVar37._8_4_ = uVar53;
  auVar37._12_4_ = uVar53;
  auVar37._16_4_ = uVar53;
  auVar37._20_4_ = uVar53;
  auVar37._24_4_ = uVar53;
  auVar37._28_4_ = uVar53;
  auVar22 = vpermps_avx512vl(auVar21,ZEXT1632(auVar49));
  auVar23 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar24 = vpermps_avx512vl(auVar23,ZEXT1632(auVar49));
  auVar25 = vbroadcastss_avx512vl(auVar13);
  auVar26 = vpermps_avx512vl(auVar21,ZEXT1632(auVar13));
  auVar27 = vpermps_avx512vl(auVar23,ZEXT1632(auVar13));
  auVar28 = vbroadcastss_avx512vl(auVar17);
  auVar29 = vpermps_avx512vl(auVar21,ZEXT1632(auVar17));
  auVar30 = vpermps_avx512vl(auVar23,ZEXT1632(auVar17));
  auVar31 = vbroadcastss_avx512vl(auVar68);
  auVar32 = vpermps_avx512vl(auVar21,ZEXT1632(auVar68));
  auVar33 = vpermps_avx512vl(auVar23,ZEXT1632(auVar68));
  auVar34 = vmulps_avx512vl(auVar31,bezier_basis0._3944_32_);
  auVar35 = vmulps_avx512vl(auVar32,bezier_basis0._3944_32_);
  auVar36 = vmulps_avx512vl(auVar33,bezier_basis0._3944_32_);
  auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._2788_32_,auVar28);
  auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._2788_32_,auVar29);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._2788_32_,auVar30);
  auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._1632_32_,auVar25);
  auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._1632_32_,auVar26);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._1632_32_,auVar27);
  auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._476_32_,auVar37);
  auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._476_32_,auVar22);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._476_32_,auVar24);
  auVar31 = vmulps_avx512vl(auVar31,bezier_basis0._8568_32_);
  auVar32 = vmulps_avx512vl(auVar32,bezier_basis0._8568_32_);
  auVar33 = vmulps_avx512vl(auVar33,bezier_basis0._8568_32_);
  auVar28 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._7412_32_,auVar28);
  auVar29 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._7412_32_,auVar29);
  auVar30 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._7412_32_,auVar30);
  auVar25 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._6256_32_,auVar25);
  auVar26 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._6256_32_,auVar26);
  auVar27 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._6256_32_,auVar27);
  auVar25 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._5100_32_,auVar37);
  auVar22 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._5100_32_,auVar22);
  auVar24 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._5100_32_,auVar24);
  auVar29._8_4_ = 0x3d638e39;
  auVar29._0_8_ = 0x3d638e393d638e39;
  auVar29._12_4_ = 0x3d638e39;
  auVar29._16_4_ = 0x3d638e39;
  auVar29._20_4_ = 0x3d638e39;
  auVar29._24_4_ = 0x3d638e39;
  auVar29._28_4_ = 0x3d638e39;
  auVar27 = vmulps_avx512vl(auVar25,auVar29);
  auVar28 = vmulps_avx512vl(auVar22,auVar29);
  auVar29 = vmulps_avx512vl(auVar24,auVar29);
  auVar22 = vblendps_avx(auVar27,ZEXT832(0) << 0x20,1);
  auVar24 = vblendps_avx(auVar28,ZEXT832(0) << 0x20,1);
  auVar32 = ZEXT832(0) << 0x20;
  auVar25 = vblendps_avx(auVar29,auVar32,1);
  auVar26 = vsubps_avx(auVar34,auVar22);
  auVar30 = vsubps_avx512vl(auVar35,auVar24);
  auVar31 = vsubps_avx512vl(auVar36,auVar25);
  auVar22 = vblendps_avx(auVar27,auVar32,0x80);
  auVar24 = vblendps_avx(auVar28,auVar32,0x80);
  auVar25 = vblendps_avx(auVar29,auVar32,0x80);
  auVar39._0_4_ = auVar34._0_4_ + auVar22._0_4_;
  auVar39._4_4_ = auVar34._4_4_ + auVar22._4_4_;
  auVar39._8_4_ = auVar34._8_4_ + auVar22._8_4_;
  auVar39._12_4_ = auVar34._12_4_ + auVar22._12_4_;
  auVar39._16_4_ = auVar34._16_4_ + auVar22._16_4_;
  auVar39._20_4_ = auVar34._20_4_ + auVar22._20_4_;
  auVar39._24_4_ = auVar34._24_4_ + auVar22._24_4_;
  auVar39._28_4_ = auVar34._28_4_ + auVar22._28_4_;
  auVar28 = vaddps_avx512vl(auVar35,auVar24);
  auVar25 = vaddps_avx512vl(auVar36,auVar25);
  auVar78._8_4_ = 0x7f800000;
  auVar78._0_8_ = 0x7f8000007f800000;
  auVar78._12_4_ = 0x7f800000;
  auVar78._16_4_ = 0x7f800000;
  auVar78._20_4_ = 0x7f800000;
  auVar78._24_4_ = 0x7f800000;
  auVar78._28_4_ = 0x7f800000;
  auVar22 = vminps_avx(auVar78,auVar34);
  auVar29 = vminps_avx512vl(auVar78,auVar35);
  auVar32 = vminps_avx512vl(auVar78,auVar36);
  auVar24 = vminps_avx(auVar26,auVar39);
  auVar27 = vminps_avx(auVar22,auVar24);
  auVar22 = vminps_avx512vl(auVar30,auVar28);
  auVar33 = vminps_avx512vl(auVar29,auVar22);
  auVar22 = vminps_avx512vl(auVar31,auVar25);
  auVar32 = vminps_avx512vl(auVar32,auVar22);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar24 = vmaxps_avx512vl(auVar37,auVar34);
  auVar29 = vmaxps_avx512vl(auVar37,auVar35);
  auVar34 = vmaxps_avx512vl(auVar37,auVar36);
  auVar22 = vmaxps_avx(auVar26,auVar39);
  auVar35 = vmaxps_avx512vl(auVar24,auVar22);
  auVar22 = vmaxps_avx512vl(auVar30,auVar28);
  auVar36 = vmaxps_avx512vl(auVar29,auVar22);
  auVar22 = vmaxps_avx512vl(auVar31,auVar25);
  auVar31 = vmaxps_avx512vl(auVar34,auVar22);
  auVar22 = vbroadcastss_avx512vl(auVar19);
  auVar24 = vpermps_avx512vl(auVar21,ZEXT1632(auVar19));
  auVar25 = vpermps_avx512vl(auVar23,ZEXT1632(auVar19));
  auVar26 = vbroadcastss_avx512vl(auVar16);
  auVar28 = vpermps_avx512vl(auVar21,ZEXT1632(auVar16));
  auVar29 = vpermps_avx512vl(auVar23,ZEXT1632(auVar16));
  auVar30 = vbroadcastss_avx512vl(auVar18);
  auVar34 = vpermps_avx512vl(auVar21,ZEXT1632(auVar18));
  auVar38 = vpermps_avx512vl(auVar23,ZEXT1632(auVar18));
  uVar53 = auVar20._0_4_;
  auVar42._4_4_ = uVar53;
  auVar42._0_4_ = uVar53;
  auVar42._8_4_ = uVar53;
  auVar42._12_4_ = uVar53;
  auVar42._16_4_ = uVar53;
  auVar42._20_4_ = uVar53;
  auVar42._24_4_ = uVar53;
  auVar42._28_4_ = uVar53;
  auVar21 = vpermps_avx512vl(auVar21,ZEXT1632(auVar20));
  auVar23 = vpermps_avx512vl(auVar23,ZEXT1632(auVar20));
  auVar39 = vmulps_avx512vl(auVar42,bezier_basis0._3944_32_);
  auVar40 = vmulps_avx512vl(auVar21,bezier_basis0._3944_32_);
  auVar41 = vmulps_avx512vl(auVar23,bezier_basis0._3944_32_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._2788_32_,auVar30);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._2788_32_,auVar34);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar38,bezier_basis0._2788_32_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._1632_32_,auVar26);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._1632_32_,auVar28);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar29,bezier_basis0._1632_32_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._476_32_,auVar22);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._476_32_,auVar24);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar25,bezier_basis0._476_32_);
  auVar42 = vmulps_avx512vl(auVar42,bezier_basis0._8568_32_);
  auVar21 = vmulps_avx512vl(auVar21,bezier_basis0._8568_32_);
  auVar23 = vmulps_avx512vl(auVar23,bezier_basis0._8568_32_);
  auVar30 = vfmadd231ps_avx512vl(auVar42,bezier_basis0._7412_32_,auVar30);
  auVar21 = vfmadd231ps_avx512vl(auVar21,bezier_basis0._7412_32_,auVar34);
  auVar23 = vfmadd231ps_avx512vl(auVar23,bezier_basis0._7412_32_,auVar38);
  auVar26 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._6256_32_,auVar26);
  auVar21 = vfmadd231ps_avx512vl(auVar21,bezier_basis0._6256_32_,auVar28);
  auVar23 = vfmadd231ps_avx512vl(auVar23,bezier_basis0._6256_32_,auVar29);
  auVar20 = vfmadd231ps_fma(auVar26,bezier_basis0._5100_32_,auVar22);
  auVar15 = vfmadd231ps_fma(auVar21,bezier_basis0._5100_32_,auVar24);
  auVar22 = vfmadd231ps_avx512vl(auVar23,bezier_basis0._5100_32_,auVar25);
  auVar23 = ZEXT1632(CONCAT412(auVar20._12_4_ * 0.055555556,
                               CONCAT48(auVar20._8_4_ * 0.055555556,
                                        CONCAT44(auVar20._4_4_ * 0.055555556,
                                                 auVar20._0_4_ * 0.055555556))));
  auVar26._28_4_ = bezier_basis0._5128_4_;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar15._12_4_ * 0.055555556,
                          CONCAT48(auVar15._8_4_ * 0.055555556,
                                   CONCAT44(auVar15._4_4_ * 0.055555556,auVar15._0_4_ * 0.055555556)
                                  )));
  auVar21._4_4_ = auVar22._4_4_ * 0.055555556;
  auVar21._0_4_ = auVar22._0_4_ * 0.055555556;
  auVar21._8_4_ = auVar22._8_4_ * 0.055555556;
  auVar21._12_4_ = auVar22._12_4_ * 0.055555556;
  auVar21._16_4_ = auVar22._16_4_ * 0.055555556;
  auVar21._20_4_ = auVar22._20_4_ * 0.055555556;
  auVar21._24_4_ = auVar22._24_4_ * 0.055555556;
  auVar21._28_4_ = 0x3d638e39;
  auVar34 = ZEXT832(0) << 0x20;
  auVar22 = vblendps_avx(auVar23,auVar34,1);
  auVar24 = vblendps_avx(auVar26,auVar34,1);
  auVar25 = vblendps_avx(auVar21,auVar34,1);
  auVar28 = vsubps_avx(auVar39,auVar22);
  auVar29 = vsubps_avx(auVar40,auVar24);
  auVar30 = vsubps_avx(auVar41,auVar25);
  auVar22 = vblendps_avx(auVar23,auVar34,0x80);
  auVar24 = vblendps_avx(auVar26,auVar34,0x80);
  auVar25 = vblendps_avx(auVar21,auVar34,0x80);
  auVar38._0_4_ = auVar39._0_4_ + auVar22._0_4_;
  auVar38._4_4_ = auVar39._4_4_ + auVar22._4_4_;
  auVar38._8_4_ = auVar39._8_4_ + auVar22._8_4_;
  auVar38._12_4_ = auVar39._12_4_ + auVar22._12_4_;
  auVar38._16_4_ = auVar39._16_4_ + auVar22._16_4_;
  auVar38._20_4_ = auVar39._20_4_ + auVar22._20_4_;
  auVar38._24_4_ = auVar39._24_4_ + auVar22._24_4_;
  auVar38._28_4_ = auVar39._28_4_ + auVar22._28_4_;
  auVar82._0_4_ = auVar24._0_4_ + auVar40._0_4_;
  auVar82._4_4_ = auVar24._4_4_ + auVar40._4_4_;
  auVar82._8_4_ = auVar24._8_4_ + auVar40._8_4_;
  auVar82._12_4_ = auVar24._12_4_ + auVar40._12_4_;
  auVar82._16_4_ = auVar24._16_4_ + auVar40._16_4_;
  auVar82._20_4_ = auVar24._20_4_ + auVar40._20_4_;
  auVar82._24_4_ = auVar24._24_4_ + auVar40._24_4_;
  auVar82._28_4_ = auVar24._28_4_ + auVar40._28_4_;
  auVar87._0_4_ = auVar41._0_4_ + auVar25._0_4_;
  auVar87._4_4_ = auVar41._4_4_ + auVar25._4_4_;
  auVar87._8_4_ = auVar41._8_4_ + auVar25._8_4_;
  auVar87._12_4_ = auVar41._12_4_ + auVar25._12_4_;
  auVar87._16_4_ = auVar41._16_4_ + auVar25._16_4_;
  auVar87._20_4_ = auVar41._20_4_ + auVar25._20_4_;
  auVar87._24_4_ = auVar41._24_4_ + auVar25._24_4_;
  auVar87._28_4_ = auVar41._28_4_ + auVar25._28_4_;
  auVar22 = vminps_avx(auVar78,auVar39);
  auVar24 = vminps_avx(auVar78,auVar40);
  auVar25 = vminps_avx(auVar78,auVar41);
  auVar26 = vminps_avx(auVar28,auVar38);
  auVar34 = vminps_avx512vl(auVar22,auVar26);
  auVar22 = vminps_avx(auVar29,auVar82);
  auVar21 = vminps_avx(auVar24,auVar22);
  auVar22 = vminps_avx(auVar30,auVar87);
  auVar23 = vminps_avx(auVar25,auVar22);
  auVar24 = vmaxps_avx512vl(auVar37,auVar39);
  auVar25 = vmaxps_avx512vl(auVar37,auVar40);
  auVar26 = vmaxps_avx512vl(auVar37,auVar41);
  auVar22 = vmaxps_avx(auVar28,auVar38);
  auVar22 = vmaxps_avx(auVar24,auVar22);
  auVar24 = vmaxps_avx(auVar29,auVar82);
  auVar24 = vmaxps_avx(auVar25,auVar24);
  auVar25 = vmaxps_avx(auVar30,auVar87);
  auVar25 = vmaxps_avx(auVar26,auVar25);
  auVar26 = vshufps_avx512vl(auVar35,auVar35,0xb1);
  auVar28 = vmaxps_avx512vl(auVar35,auVar26);
  auVar26 = vshufpd_avx(auVar28,auVar28,5);
  auVar26 = vmaxps_avx(auVar28,auVar26);
  auVar20 = vmaxps_avx(auVar26._0_16_,auVar26._16_16_);
  auVar26 = vshufps_avx512vl(auVar36,auVar36,0xb1);
  auVar28 = vmaxps_avx512vl(auVar36,auVar26);
  auVar26 = vshufpd_avx(auVar28,auVar28,5);
  auVar26 = vmaxps_avx(auVar28,auVar26);
  auVar15 = vmaxps_avx(auVar26._0_16_,auVar26._16_16_);
  auVar15 = vunpcklps_avx(auVar20,auVar15);
  auVar26 = vshufps_avx(auVar31,auVar31,0xb1);
  auVar26 = vmaxps_avx(auVar31,auVar26);
  auVar28 = vshufpd_avx(auVar26,auVar26,5);
  auVar26 = vmaxps_avx(auVar26,auVar28);
  auVar20 = vmaxps_avx(auVar26._0_16_,auVar26._16_16_);
  auVar20 = vinsertps_avx(auVar15,auVar20,0x28);
  auVar26 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar26 = vminps_avx(auVar27,auVar26);
  auVar27 = vshufpd_avx(auVar26,auVar26,5);
  auVar26 = vminps_avx(auVar26,auVar27);
  auVar15 = vminps_avx(auVar26._0_16_,auVar26._16_16_);
  auVar26 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar26 = vminps_avx(auVar33,auVar26);
  auVar27 = vshufpd_avx(auVar26,auVar26,5);
  auVar26 = vminps_avx(auVar26,auVar27);
  auVar18 = vminps_avx(auVar26._0_16_,auVar26._16_16_);
  auVar18 = vunpcklps_avx(auVar15,auVar18);
  auVar26 = vshufps_avx512vl(auVar32,auVar32,0xb1);
  auVar27 = vminps_avx512vl(auVar32,auVar26);
  auVar26 = vshufpd_avx(auVar27,auVar27,5);
  auVar26 = vminps_avx(auVar27,auVar26);
  auVar15 = vminps_avx(auVar26._0_16_,auVar26._16_16_);
  auVar15 = vinsertps_avx(auVar18,auVar15,0x28);
  auVar26 = vshufps_avx512vl(auVar34,auVar34,0xb1);
  auVar27 = vminps_avx512vl(auVar34,auVar26);
  auVar26 = vshufpd_avx(auVar27,auVar27,5);
  auVar26 = vminps_avx(auVar27,auVar26);
  auVar18 = vminps_avx(auVar26._0_16_,auVar26._16_16_);
  auVar26 = vshufps_avx(auVar21,auVar21,0xb1);
  auVar26 = vminps_avx(auVar21,auVar26);
  auVar27 = vshufpd_avx(auVar26,auVar26,5);
  auVar26 = vminps_avx(auVar26,auVar27);
  auVar17 = vminps_avx(auVar26._0_16_,auVar26._16_16_);
  auVar17 = vunpcklps_avx(auVar18,auVar17);
  auVar26 = vshufps_avx(auVar23,auVar23,0xb1);
  auVar26 = vminps_avx(auVar23,auVar26);
  auVar27 = vshufpd_avx(auVar26,auVar26,5);
  auVar26 = vminps_avx(auVar26,auVar27);
  auVar18 = vminps_avx(auVar26._0_16_,auVar26._16_16_);
  auVar18 = vinsertps_avx(auVar17,auVar18,0x28);
  auVar17 = vminps_avx(auVar15,auVar18);
  auVar26 = vshufps_avx(auVar22,auVar22,0xb1);
  auVar22 = vmaxps_avx(auVar22,auVar26);
  auVar26 = vshufpd_avx(auVar22,auVar22,5);
  auVar22 = vmaxps_avx(auVar22,auVar26);
  auVar15 = vmaxps_avx(auVar22._0_16_,auVar22._16_16_);
  auVar22 = vshufps_avx(auVar24,auVar24,0xb1);
  auVar22 = vmaxps_avx(auVar24,auVar22);
  auVar24 = vshufpd_avx(auVar22,auVar22,5);
  auVar22 = vmaxps_avx(auVar22,auVar24);
  auVar18 = vmaxps_avx(auVar22._0_16_,auVar22._16_16_);
  auVar18 = vunpcklps_avx(auVar15,auVar18);
  auVar22 = vshufps_avx(auVar25,auVar25,0xb1);
  auVar22 = vmaxps_avx(auVar25,auVar22);
  auVar24 = vshufpd_avx(auVar22,auVar22,5);
  auVar22 = vmaxps_avx(auVar22,auVar24);
  auVar15 = vmaxps_avx(auVar22._0_16_,auVar22._16_16_);
  auVar15 = vinsertps_avx(auVar18,auVar15,0x28);
  auVar18 = vmaxps_avx(auVar20,auVar15);
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar20 = vandps_avx(auVar17,auVar15);
  auVar15 = vandps_avx(auVar18,auVar15);
  auVar20 = vmaxps_avx(auVar20,auVar15);
  auVar15 = vmovshdup_avx(auVar20);
  auVar15 = vmaxss_avx(auVar15,auVar20);
  auVar20 = vshufpd_avx(auVar20,auVar20,1);
  auVar20 = vmaxss_avx(auVar20,auVar15);
  fVar67 = auVar20._0_4_ * 4.7683716e-07;
  auVar49._4_4_ = fVar67;
  auVar49._0_4_ = fVar67;
  auVar49._8_4_ = fVar67;
  auVar49._12_4_ = fVar67;
  aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar17,auVar49);
  (__return_storage_ptr__->lower).field_0 = aVar2;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar18._0_4_ + fVar67;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar18._4_4_ + fVar67;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar18._8_4_ + fVar67;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar18._12_4_ + fVar67;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }